

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O0

void __thiscall
TPZCreateApproximationSpace::BuildMesh
          (TPZCreateApproximationSpace *this,TPZCompMesh *cmesh,TPZVec<long> *gelindexes)

{
  int iVar1;
  int64_t iVar2;
  TPZGeoEl *pTVar3;
  TPZGeoEl **ppTVar4;
  TPZCompEl *pTVar5;
  TPZMaterial *pTVar6;
  TPZVec<long> *in_RDX;
  TPZCompMesh *in_RSI;
  long in_RDI;
  TPZMaterial *mat;
  int matid;
  TPZGeoEl *gel_1;
  int64_t nbl;
  set<int,_std::less<int>,_std::allocator<int>_> matnotfound;
  TPZGeoEl *gel;
  int64_t index;
  int64_t neltocreate;
  int64_t nelem;
  int64_t i;
  int64_t el;
  TPZGeoMesh *gmesh;
  TPZVec<TPZGeoEl_*> elvec;
  int64_t in_stack_fffffffffffffe48;
  TPZCompMesh *in_stack_fffffffffffffe50;
  TPZCompMesh *in_stack_fffffffffffffe58;
  TPZAdmChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  TPZCompMesh *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  int64_t local_60;
  int64_t local_58;
  TPZVec<TPZGeoEl_*> local_38;
  TPZVec<long> *local_18;
  TPZCompMesh *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  TPZVec<long>::size(in_RDX);
  TPZVec<TPZGeoEl_*>::TPZVec
            ((TPZVec<TPZGeoEl_*> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  TPZCompMesh::Reference(local_10);
  for (local_58 = 0; iVar2 = TPZVec<long>::size(local_18), local_58 < iVar2; local_58 = local_58 + 1
      ) {
    TPZVec<long>::operator[](local_18,local_58);
    pTVar3 = TPZGeoMesh::Element((TPZGeoMesh *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    ppTVar4 = TPZVec<TPZGeoEl_*>::operator[](&local_38,local_58);
    *ppTVar4 = pTVar3;
  }
  iVar2 = TPZVec<TPZGeoEl_*>::NElements(&local_38);
  for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
    ppTVar4 = TPZVec<TPZGeoEl_*>::operator[](&local_38,local_60);
    if (*ppTVar4 != (TPZGeoEl *)0x0) {
      TPZGeoEl::Reference(*ppTVar4);
    }
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ba9077);
  TPZCompMesh::Block(local_10);
  iVar1 = TPZBlock::NBlocks((TPZBlock *)0x1ba9095);
  if (iVar1 < 0) {
    TPZCompMesh::Block(local_10);
    TPZBlock::SetNBlocks
              ((TPZBlock *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
               (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  }
  TPZCompMesh::Block(local_10);
  TPZBlock::SetNBlocks
            ((TPZBlock *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
    ppTVar4 = TPZVec<TPZGeoEl_*>::operator[](&local_38,local_60);
    pTVar3 = *ppTVar4;
    if ((pTVar3 != (TPZGeoEl *)0x0) &&
       (pTVar5 = TPZGeoEl::Reference(pTVar3), pTVar5 == (TPZCompEl *)0x0)) {
      TPZGeoEl::MaterialId(pTVar3);
      pTVar6 = TPZCompMesh::FindMaterial(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      if (pTVar6 == (TPZMaterial *)0x0) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
                   (value_type_conflict4 *)
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
      else {
        in_stack_fffffffffffffe70 = (TPZCompMesh *)TPZGeoEl::Reference(pTVar3);
        if (((in_stack_fffffffffffffe70 == (TPZCompMesh *)0x0) &&
            (in_stack_fffffffffffffe6c = TPZGeoEl::NumInterfaces(pTVar3),
            in_stack_fffffffffffffe6c == 0)) &&
           (CreateCompEl((TPZCreateApproximationSpace *)(ulong)in_stack_fffffffffffffe68,
                         (TPZGeoEl *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58),
           (*(byte *)(in_RDI + 0x108) & 1) != 0)) {
          in_stack_fffffffffffffe60 = TPZCompMesh::ElementVec(local_10);
          in_stack_fffffffffffffe58 =
               (TPZCompMesh *)
               TPZChunkVector<TPZCompEl_*,_10>::operator[]
                         ((TPZChunkVector<TPZCompEl_*,_10> *)in_stack_fffffffffffffe70,
                          CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          in_stack_fffffffffffffe50 =
               (TPZCompMesh *)TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe58);
          TPZGeoEl::ResetReference((TPZGeoEl *)in_stack_fffffffffffffe50);
        }
      }
    }
  }
  TPZCompMesh::InitializeBlock(in_stack_fffffffffffffe50);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1ba9337);
  TPZVec<TPZGeoEl_*>::~TPZVec((TPZVec<TPZGeoEl_*> *)in_stack_fffffffffffffe50);
  return;
}

Assistant:

void TPZCreateApproximationSpace::BuildMesh(TPZCompMesh &cmesh, const TPZVec<int64_t> &gelindexes) const {
    TPZVec<TPZGeoEl *> elvec(gelindexes.size());
    TPZGeoMesh *gmesh = cmesh.Reference();
    for(int64_t el = 0; el<gelindexes.size(); el++)
    {
        elvec[el] = gmesh->Element(gelindexes[el]);
    }
	int64_t i, nelem = elvec.NElements();
	int64_t neltocreate = 0;
	int64_t index;
	for(i=0; i<nelem; i++) {
		TPZGeoEl *gel = elvec[i];
		if(!gel) continue;
        if (gel->Reference()) {
            continue;
        }
	}
	std::set<int> matnotfound;
	int64_t nbl = cmesh.Block().NBlocks();
    if(neltocreate > nbl) 
    {
        cmesh.Block().SetNBlocks(neltocreate);
    }
    cmesh.Block().SetNBlocks(nbl);
	
	for(i=0; i<nelem; i++) {
		TPZGeoEl *gel = elvec[i];
		if(!gel || gel->Reference()) continue;
        int matid = gel->MaterialId();
        TPZMaterial * mat = cmesh.FindMaterial(matid);
        if(!mat)
        {
            matnotfound.insert(matid);
            continue;
        }
        
        if(!gel->Reference() && gel->NumInterfaces() == 0)
        {
            CreateCompEl(gel,cmesh);
            if (fCreateHybridMesh) {
                cmesh.ElementVec()[index]->Reference()->ResetReference();
            }
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {

                std::stringstream sout;
                if (index < 0) {
                    if(gel->Dimension() == 0){
                        sout << "Zero dimensional element, is your approximation space Hdiv?. " << std::endl;
                        gel->Print(sout);
                        sout << "No computational element was created. " << std::endl;
                    }
                }else{
                    cmesh.ElementVec()[index]->Print(sout);
                }
                LOGPZ_DEBUG(logger, sout.str())
            }
#endif
        }
	}
	cmesh.InitializeBlock();
}